

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.h
# Opt level: O0

void __thiscall slang::driver::Driver::Options::~Options(Options *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  boost::unordered::
  unordered_flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_flat_set
            ((unordered_flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x23581f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x235841);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x235852);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x235863);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::
  map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
  ::~map((map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
          *)0x2358a7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2358b8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2358c9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2358da);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x23591f);
  return;
}

Assistant:

struct SLANG_EXPORT Options {
        /// The version of the SystemVerilog language to use.
        std::optional<std::string> languageVersion;

        /// @name Preprocessing
        /// @{

        /// The maximum depth of included files before an error is issued.
        std::optional<uint32_t> maxIncludeDepth;

        /// A list of macros that should be defined in each compilation unit.
        std::vector<std::string> defines;

        /// A list of macros that should be undefined in each compilation unit.
        std::vector<std::string> undefines;

        /// If true, library files will inherit macro definitions from primary source files.
        std::optional<bool> librariesInheritMacros;

        /// If true, the preprocessor will support legacy protected envelope directives,
        /// for compatibility with old Verilog tools.
        std::optional<bool> enableLegacyProtect;

        /// A set of preprocessor directives to be ignored.
        std::vector<std::string> ignoreDirectives;

        /// A set of options controlling translate-off comment directives.
        std::vector<std::string> translateOffOptions;

        /// @}
        /// @name Parsing
        /// @{

        /// The maximum call stack depth of parsing before an error is issued.
        std::optional<uint32_t> maxParseDepth;

        /// The maximum number of lexer errors that can be encountered before giving up.
        std::optional<uint32_t> maxLexerErrors;

        /// The number of threads to use for parsing.
        std::optional<uint32_t> numThreads;

        /// @}
        /// @name Compilation
        /// @{

        /// The maximum depth of nested module instances (and interfaces/programs),
        /// to detect infinite recursion.
        std::optional<uint32_t> maxInstanceDepth;

        /// The maximum number of steps that will be taken when expanding a single
        /// generate construct, to detect infinite loops.
        std::optional<uint32_t> maxGenerateSteps;

        /// The maximum depth of nested function calls in constant expressions,
        /// to detect infinite recursion.
        std::optional<uint32_t> maxConstexprDepth;

        /// The maximum number of steps to allow when evaluating a constant expressions,
        /// to detect infinite loops.
        std::optional<uint32_t> maxConstexprSteps;

        /// The maximum number of frames in a callstack to display in diagnostics
        /// before abbreviating them.
        std::optional<uint32_t> maxConstexprBacktrace;

        /// The maximum number of instances allowed in a single instance array.
        std::optional<uint32_t> maxInstanceArray;

        /// The maximum number of UDP coverage notes that will be generated for a single
        /// warning about missing edge transitions.
        std::optional<uint32_t> maxUDPCoverageNotes;

        /// A string indicating a member of @a CompatMode to use for tailoring
        /// other compilation options.
        std::optional<std::string> compat;

        /// A string indicating a member of @a MinTypMax to indicate which set
        /// of (min:typ:max) expressions is valid for this compilation.
        std::optional<std::string> minTypMax;

        /// A string that indicates the default time scale to use for
        /// any design elements that don't specify one explicitly.
        std::optional<std::string> timeScale;

        /// A collection of flags that control compilation.
        std::map<ast::CompilationFlags, std::optional<bool>> compilationFlags;

        /// If non-empty, specifies the list of modules that should serve as the
        /// top modules in the design. If empty, this will be automatically determined
        /// based on which modules are unreferenced elsewhere.
        std::vector<std::string> topModules;

        /// A list of parameters to override, of the form &lt;name>=&lt;value> -- note that
        /// for now at least this only applies to parameters in top-level modules.
        std::vector<std::string> paramOverrides;

        /// A list of library names specifying the order in which module lookup
        /// should be resolved between libraries.
        std::vector<std::string> libraryOrder;

        /// The name of the default library; if not set, defaults to "work".
        std::optional<std::string> defaultLibName;

        /// @}
        /// @name Diagnostics control
        /// @{

        /// If true, print diagnostics with color.
        std::optional<bool> colorDiags;

        /// If true, include column numbers in printed diagnostics.
        std::optional<bool> diagColumn;

        /// If true, include location information in printed diagnostics.
        std::optional<bool> diagLocation;

        /// If true, include source line context in printed diagnostics.
        std::optional<bool> diagSourceLine;

        /// If true, include warning option names in printed diagnostics.
        std::optional<bool> diagOptionName;

        /// If true, include file include stacks in printed diagnostics.
        std::optional<bool> diagIncludeStack;

        /// If true, include macro expansion information in printed diagnostics.
        std::optional<bool> diagMacroExpansion;

        /// If true, display absolute paths to files in printed diagnostics.
        std::optional<bool> diagAbsPaths;

        /// One of the ShowHierarchyPathOption values that control whether to
        /// include hierarchy paths in printed diagnostics.
        std::optional<std::string> diagHierarchy;

        /// If set, the path to a JSON file that will be written with diagnostic information.
        /// Can be '-' to indicate that the JSON should be written to stdout.
        std::optional<std::string> diagJson;

        /// The maximum number of errors to print before giving up.
        std::optional<uint32_t> errorLimit;

        /// A list of warning options that will be passed to the DiagnosticEngine.
        std::vector<std::string> warningOptions;

        /// @}
        /// @name File lists
        /// @{

        /// If set to true, all source files will be treated as part of a single
        /// compilation unit, meaning all of their text will be merged together.
        std::optional<bool> singleUnit;

        /// A set of extensions that will be used to exclude files.
        flat_hash_set<std::string> excludeExts;

        /// @}
        /// @name Analysis
        /// @{

        /// Respect the unique and priority keywords in data flow analysis.
        std::optional<bool> dfaUniquePriority;

        /// Require case coverage to include X and Z bits in data flow analysis.
        std::optional<bool> dfaFourState;

        /// The maximum number of steps to take when analyzing a case statement.
        std::optional<uint32_t> maxCaseAnalysisSteps;

        /// @}

        /// Returns true if the lintMode option is provided.
        bool lintMode() const;
    }